

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

void tcg_dump_op_mipsel(TCGContext_conflict4 *s,_Bool have_prefs,TCGOp *op)

{
  byte bVar1;
  byte bVar2;
  undefined8 uVar3;
  FILE *pFVar4;
  uint uVar5;
  gpointer pvVar6;
  char *in_RCX;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  undefined8 *puVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  char buf [128];
  char local_b8 [136];
  
  pFVar4 = _stderr;
  uVar16 = *(uint *)op;
  uVar5 = uVar16 & 0xff;
  puVar14 = (undefined8 *)((long)&s->tcg_op_defs->name + (ulong)(uVar5 << 5));
  if ((byte)uVar16 == 2) {
    uVar5 = uVar16 >> 0xc & 0xf;
    uVar7 = (ulong)uVar5;
    uVar16 = uVar16 >> 8 & 0xf;
    uVar3 = *puVar14;
    if ((s->helper_table == (GHashTable *)0x0) ||
       (pvVar6 = g_hash_table_lookup(s->helper_table,(gconstpointer)op->args[uVar5 + uVar16]),
       pvVar6 == (gpointer)0x0)) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = *(char **)((long)pvVar6 + 8);
    }
    fprintf(pFVar4," %s %s,$0x%lx,$%d",uVar3,pcVar9,op->args[(ulong)(uVar5 + uVar16) + 1],uVar7);
    if (uVar5 != 0) {
      pcVar9 = local_b8;
      tcg_dump_op_mipsel_cold_1();
    }
    if (uVar16 != 0) {
      uVar15 = 0;
      do {
        pcVar8 = "<dummy>";
        if (op->args[uVar7 + uVar15] != 0) {
          tcg_get_arg_str(s,local_b8,(int)op->args[uVar7 + uVar15],(TCGArg)pcVar9);
          pcVar8 = local_b8;
        }
        fprintf(_stderr,",%s",pcVar8);
        uVar15 = uVar15 + 1;
      } while (uVar16 != uVar15);
    }
    goto LAB_007d0090;
  }
  if (uVar5 == 0x81) {
    tcg_dump_op_mipsel_cold_2();
    uVar7 = 0;
    goto LAB_007d0090;
  }
  fprintf(_stderr," %s ",*puVar14);
  uVar7 = (ulong)*(byte *)(puVar14 + 1);
  bVar1 = *(byte *)((long)puVar14 + 9);
  uVar11 = (uint)bVar1;
  bVar2 = *(byte *)((long)puVar14 + 10);
  if ((*(byte *)((long)puVar14 + 0xc) & 0x40) != 0) {
    tcg_dump_op_mipsel_cold_3();
  }
  if (uVar7 != 0) {
    in_RCX = local_b8;
    tcg_dump_op_mipsel_cold_4();
  }
  uVar15 = uVar7;
  uVar10 = uVar7;
  if (bVar1 != 0) {
    do {
      if (uVar15 != 0) {
        fputc(0x2c,_stderr);
      }
      pFVar4 = _stderr;
      uVar10 = uVar15 + 1;
      tcg_get_arg_str(s,local_b8,(int)op->args[uVar15],(TCGArg)in_RCX);
      fputs(local_b8,pFVar4);
      uVar11 = uVar11 - 1;
      uVar15 = uVar10;
    } while (uVar11 != 0);
  }
  uVar17 = uVar16 & 0xff;
  uVar13 = 0;
  uVar11 = (uint)uVar10;
  if (uVar17 < 0x85) {
    if (((uVar17 - 7 < 0x3c) && ((0xc0000c080000003U >> ((ulong)(uVar17 - 7) & 0x3f) & 1) != 0)) ||
       (uVar17 == 0x67)) {
LAB_007cfe64:
      if (((uint)op->args[uVar10 & 0xffffffff] & 0xe) == 6 || 0xd < op->args[uVar10 & 0xffffffff]) {
        fprintf(_stderr,",$0x%lx");
      }
      else {
        tcg_dump_op_mipsel_cold_6();
      }
LAB_007cff86:
      uVar11 = uVar11 + 1;
      uVar13 = 1;
    }
  }
  else {
    if (uVar17 - 0x85 < 4) {
      uVar13 = (uint)op->args[uVar10 & 0xffffffff];
      if (uVar13 < 0x800) {
        tcg_dump_op_mipsel_cold_5();
      }
      else {
        fprintf(_stderr,",$0x%x,%u",op->args[uVar10 & 0xffffffff] >> 4 & 0xfffffff,
                (ulong)(uVar13 & 0xf));
      }
      goto LAB_007cff86;
    }
    if ((uVar17 == 0xae) || (uVar17 == 0xac)) goto LAB_007cfe64;
  }
  if ((((byte)uVar16 < 0x2e) && ((0x20400000000aU >> ((ulong)uVar17 & 0x3f) & 1) != 0)) ||
     (uVar17 == 0x67)) {
    pcVar9 = ",";
    if (uVar11 == 0) {
      pcVar9 = "";
    }
    fprintf(_stderr,"%s$L%d",pcVar9,(ulong)(*(uint *)op->args[(int)uVar11] >> 2 & 0x3fff));
    uVar13 = uVar13 + 1;
    uVar11 = uVar11 + 1;
  }
  if (uVar13 < bVar2) {
    lVar12 = 0;
    do {
      pcVar9 = ",";
      if (-lVar12 == (ulong)uVar11) {
        pcVar9 = "";
      }
      fprintf(_stderr,"%s$0x%lx",pcVar9,op->args[(ulong)uVar11 + lVar12]);
      lVar12 = lVar12 + 1;
    } while (bVar2 - uVar13 != (int)lVar12);
  }
  if (((uVar5 == 0x3f) && (op->args[1] != 0)) && (*(char *)(op->args[1] + 1) == '\x02')) {
    tcg_dump_op_mipsel_cold_7();
  }
LAB_007d0090:
  uVar16 = *(uint *)op;
  if (0xffff < uVar16) {
    if ((uVar16 & 0x30000) != 0) {
      tcg_dump_op_mipsel_cold_8();
    }
    if (0x3ffff < uVar16) {
      tcg_dump_op_mipsel_cold_9();
    }
  }
  if ((have_prefs) && ((int)uVar7 != 0)) {
    uVar15 = 0;
    do {
      uVar16 = op->output_pref[uVar15];
      if (uVar15 == 0) {
        tcg_dump_op_mipsel_cold_10();
      }
      else {
        fputc(0x2c,_stderr);
      }
      if (uVar16 == 0xffffffff) {
        tcg_dump_op_mipsel_cold_11();
      }
      else if (uVar16 == 0) {
        tcg_dump_op_mipsel_cold_12();
      }
      else {
        fprintf(_stderr,"%#x",(ulong)uVar16);
      }
      uVar15 = uVar15 + 1;
    } while (uVar7 != uVar15);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void tcg_dump_op(TCGContext *s, bool have_prefs, TCGOp* op)
{
    char buf[128];
    int i, k, nb_oargs, nb_iargs, nb_cargs;
    const TCGOpDef *def;
    TCGOpcode c;

    c = op->opc;
    def = &s->tcg_op_defs[c];
    if (c == INDEX_op_insn_start) {
        nb_oargs = 0;
        fprintf(stderr, " ----");

        for (i = 0; i < TARGET_INSN_START_WORDS; ++i) {
            target_ulong a;
#if TARGET_LONG_BITS > TCG_TARGET_REG_BITS
            a = deposit64(op->args[i * 2], 32, 32, op->args[i * 2 + 1]);
#else
            a = op->args[i];
#endif
            fprintf(stderr, " " TARGET_FMT_lx, a);
        }
    } else if (c == INDEX_op_call) {
        /* variable number of arguments */
        nb_oargs = TCGOP_CALLO(op);
        nb_iargs = TCGOP_CALLI(op);
        nb_cargs = def->nb_cargs;

        /* function name, flags, out args */
        fprintf(stderr, " %s %s,$0x%" TCG_PRIlx ",$%d", def->name,
                      tcg_find_helper(s, op->args[nb_oargs + nb_iargs]),
                      op->args[nb_oargs + nb_iargs + 1], nb_oargs);
        for (i = 0; i < nb_oargs; i++) {
            fprintf(stderr, ",%s", tcg_get_arg_str(s, buf, sizeof(buf),
                                                 op->args[i]));
        }
        for (i = 0; i < nb_iargs; i++) {
            TCGArg arg = op->args[nb_oargs + i];
            const char *t = "<dummy>";
            if (arg != TCG_CALL_DUMMY_ARG) {
                t = tcg_get_arg_str(s, buf, sizeof(buf), arg);
            }
            fprintf(stderr, ",%s", t);
        }
    } else {
        fprintf(stderr, " %s ", def->name);

        nb_oargs = def->nb_oargs;
        nb_iargs = def->nb_iargs;
        nb_cargs = def->nb_cargs;

        if (def->flags & TCG_OPF_VECTOR) {
            fprintf(stderr, "v%d,e%d,", 64 << TCGOP_VECL(op),
                          8 << TCGOP_VECE(op));
        }

        k = 0;
        for (i = 0; i < nb_oargs; i++) {
            if (k != 0) {
                fprintf(stderr, ",");
            }
            fprintf(stderr, "%s", tcg_get_arg_str(s, buf, sizeof(buf),
                                                op->args[k++]));
        }
        for (i = 0; i < nb_iargs; i++) {
            if (k != 0) {
                fprintf(stderr, ",");
            }
            fprintf(stderr, "%s", tcg_get_arg_str(s, buf, sizeof(buf),
                                                op->args[k++]));
        }
        switch (c) {
            case INDEX_op_brcond_i32:
            case INDEX_op_setcond_i32:
            case INDEX_op_movcond_i32:
            case INDEX_op_brcond2_i32:
            case INDEX_op_setcond2_i32:
            case INDEX_op_brcond_i64:
            case INDEX_op_setcond_i64:
            case INDEX_op_movcond_i64:
            case INDEX_op_cmp_vec:
            case INDEX_op_cmpsel_vec:
                if (op->args[k] < ARRAY_SIZE(cond_name)
                    && cond_name[op->args[k]]) {
                    fprintf(stderr, ",%s", cond_name[op->args[k++]]);
                } else {
                    fprintf(stderr, ",$0x%" TCG_PRIlx, op->args[k++]);
                }
                i = 1;
                break;
            case INDEX_op_qemu_ld_i32:
            case INDEX_op_qemu_st_i32:
            case INDEX_op_qemu_ld_i64:
            case INDEX_op_qemu_st_i64:
            {
                TCGMemOpIdx oi = op->args[k++];
                MemOp op = get_memop(oi);
                unsigned ix = get_mmuidx(oi);

                if (op & ~(MO_AMASK | MO_BSWAP | MO_SSIZE)) {
                    fprintf(stderr, ",$0x%x,%u", op, ix);
                } else {
                    const char *s_al, *s_op;
                    s_al = alignment_name[(op & MO_AMASK) >> MO_ASHIFT];
                    s_op = ldst_name[op & (MO_BSWAP | MO_SSIZE)];
                    fprintf(stderr, ",%s%s,%u", s_al, s_op, ix);
                }
                i = 1;
            }
                break;
            default:
                i = 0;
                break;
        }
        switch (c) {
            case INDEX_op_set_label:
            case INDEX_op_br:
            case INDEX_op_brcond_i32:
            case INDEX_op_brcond_i64:
            case INDEX_op_brcond2_i32:
                fprintf(stderr, "%s$L%d", k ? "," : "",
                              arg_label(op->args[k])->id);
                i++, k++;
                break;
            default:
                break;
        }
        for (; i < nb_cargs; i++, k++) {
            fprintf(stderr, "%s$0x%" TCG_PRIlx, k ? "," : "", op->args[k]);
        }
        if(c == INDEX_op_mov_i64){
            struct TCGTemp* tp = arg_temp(op->args[1]);
            if (tp && tp->val_type == TEMP_VAL_MEM){
                fprintf(stderr, " mem_base=%p ", tp->mem_base);
            }
        }
    }

    if (op->life) {
        unsigned life = op->life;

        if (life & (SYNC_ARG * 3)) {
            fprintf(stderr, "  sync:");
            for (i = 0; i < 2; ++i) {
                if (life & (SYNC_ARG << i)) {
                    fprintf(stderr, " %d", i);
                }
            }
        }
        life /= DEAD_ARG;
        if (life) {
            fprintf(stderr, "  dead:");
            for (i = 0; life; ++i, life >>= 1) {
                if (life & 1) {
                    fprintf(stderr, " %d", i);
                }
            }
        }
    }

    if (have_prefs) {
        for (i = 0; i < nb_oargs; ++i) {
            TCGRegSet set = op->output_pref[i];

            if (i == 0) {
                fprintf(stderr, "  pref=");
            } else {
                fprintf(stderr, ",");
            }
            if (set == 0) {
                fprintf(stderr, "none");
            } else if (set == MAKE_64BIT_MASK(0, TCG_TARGET_NB_REGS)) {
                fprintf(stderr, "all");
#ifdef CONFIG_DEBUG_TCG
                } else if (tcg_regset_single(set)) {
                    TCGReg reg = tcg_regset_first(set);
                    fprintf(stderr, "%s", tcg_target_reg_names[reg]);
#endif
            } else if (TCG_TARGET_NB_REGS <= 32) {
                fprintf(stderr, "%#x", (uint32_t)set);
            } else {
                fprintf(stderr, "%#" PRIx64, (uint64_t)set);
            }
        }
    }

    fprintf(stderr, "\n");
}